

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O2

void henson::Serialization<henson::Scheduler::Job>::load(BinaryBuffer *bb,Job *j)

{
  (*bb->_vptr_BinaryBuffer[1])(bb,j,8);
  Serialization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  load(bb,&j->name);
  Serialization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  load(bb,&j->function);
  Serialization<henson::MemoryBuffer>::load(bb,&j->arg);
  Serialization<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::load(bb,&j->groups);
  (*bb->_vptr_BinaryBuffer[1])(bb,&j->size,8);
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Scheduler::Job& j)
    {
        henson::load(bb, j.id);
        henson::load(bb, j.name);
        henson::load(bb, j.function);
        henson::load(bb, j.arg);
        henson::load(bb, j.groups);
        henson::load(bb, j.size);
    }